

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall
FfsParser::parseGuidedSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  byte bVar1;
  UINT8 subtype;
  TreeModel *pTVar2;
  bool bVar3;
  uint uVar4;
  UINT32 UVar5;
  int32_t iVar6;
  uint uVar7;
  uint uVar8;
  UINT8 *ffsSize;
  char *pcVar9;
  uLong uVar10;
  CBString local_480;
  CBString local_468;
  CBString local_450;
  CBString local_438;
  CBString local_420;
  CBString local_408;
  CBString local_3f0;
  CBString local_3d8;
  CBString local_3c0;
  UByteArray local_3a8;
  undefined1 auStack_388 [8];
  GUIDED_SECTION_PARSING_DATA pdata_1;
  CBString local_350;
  UModelIndex local_338;
  CBString local_320;
  CBString local_308;
  CBString local_2f0;
  CBString local_2d8;
  undefined1 local_2c0 [8];
  CBString info;
  CBString name;
  UByteArray body;
  UByteArray header;
  CBString local_238;
  CBString local_220;
  CBString local_208;
  CBString local_1f0;
  undefined1 local_1d8 [8];
  UByteArray certTypeGuid;
  WIN_CERTIFICATE_UEFI_GUID *winCertificateUefiGuid;
  ushort local_196;
  undefined4 local_194;
  UINT16 certType;
  char *pcStack_190;
  UINT32 certLength;
  WIN_CERTIFICATE *winCertificate;
  char *local_170;
  EFI_AMD_ZLIB_SECTION_HEADER *amdZlibSectionHeader;
  CBString local_150;
  uint local_134;
  undefined1 local_130 [4];
  UINT32 calculated;
  uint local_114;
  undefined4 local_110;
  UINT32 crc;
  byte local_108;
  byte local_107;
  byte local_106;
  byte local_105;
  byte local_104;
  byte local_103;
  byte local_102;
  bool msgInvalidCompressedSize;
  bool msgProcessingRequiredAttributeOnUnknownGuidedSection;
  bool msgUnknownCertSubtype;
  bool msgUnknownCertType;
  bool msgInvalidCrc;
  bool msgNoProcessingRequiredAttributeSigned;
  bool msgNoProcessingRequiredAttributeCompressed;
  bool msgNoAuthStatusAttribute;
  bool msgSignedSectionFound;
  UByteArray baGuid;
  CBString additionalInfo;
  EFI_GUID_DEFINED_SECTION *guidDefinedSectionHeader_1;
  EFI_GUID_DEFINED_SECTION *guidDefinedSectionHeader;
  EFI_COMMON_SECTION_HEADER2 *section2Header;
  EFI_COMMON_SECTION_HEADER *sectionHeader;
  undefined1 auStack_a0 [4];
  UINT16 attributes;
  UINT16 dataOffset;
  EFI_GUID guid;
  UINT32 headerSize;
  VOLUME_PARSING_DATA *pdata;
  UByteArray data;
  UModelIndex parentVolumeIndex;
  UINT8 ffsVersion;
  bool insertIntoTree_local;
  UModelIndex *index_local;
  UModelIndex *parent_local;
  UINT32 localOffset_local;
  UByteArray *section_local;
  FfsParser *this_local;
  
  uVar4 = UByteArray::size(section);
  if (uVar4 < 4) {
    return 0x14;
  }
  parentVolumeIndex.m._6_1_ = '\x02';
  TreeModel::findParentOfType((UModelIndex *)((long)&data.d.field_2 + 8),this->model,parent,'A');
  bVar3 = UModelIndex::isValid((UModelIndex *)((long)&data.d.field_2 + 8));
  if ((bVar3) &&
     (bVar3 = TreeModel::hasEmptyParsingData(this->model,(UModelIndex *)((long)&data.d.field_2 + 8))
     , !bVar3)) {
    TreeModel::parsingData
              ((UByteArray *)&pdata,this->model,(UModelIndex *)((long)&data.d.field_2 + 8));
    pcVar9 = UByteArray::constData((UByteArray *)&pdata);
    parentVolumeIndex.m._6_1_ = pcVar9[0x19];
    UByteArray::~UByteArray((UByteArray *)&pdata);
  }
  ffsSize = (UINT8 *)UByteArray::constData(section);
  pcVar9 = UByteArray::constData(section);
  if ((parentVolumeIndex.m._6_1_ == '\x03') && (UVar5 = uint24ToUint32(ffsSize), UVar5 == 0xffffff))
  {
    uVar4 = UByteArray::size(section);
    if (uVar4 < 0x1c) {
      return 0x14;
    }
    guid.Data4[0] = '\x1c';
    guid.Data4[1] = '\0';
    guid.Data4[2] = '\0';
    guid.Data4[3] = '\0';
    _auStack_a0 = *(undefined8 *)(pcVar9 + 8);
    guid._0_8_ = *(undefined8 *)(pcVar9 + 0x10);
    sectionHeader._6_2_ = *(ushort *)(pcVar9 + 0x18);
    sectionHeader._4_2_ = *(ushort *)(pcVar9 + 0x1a);
  }
  else {
    guid.Data4[0] = '\x18';
    guid.Data4[1] = '\0';
    guid.Data4[2] = '\0';
    guid.Data4[3] = '\0';
    _auStack_a0 = *(undefined8 *)(ffsSize + 4);
    guid._0_8_ = *(undefined8 *)(ffsSize + 0xc);
    sectionHeader._6_2_ = *(ushort *)(ffsSize + 0x14);
    sectionHeader._4_2_ = *(ushort *)(ffsSize + 0x16);
  }
  uVar4 = UByteArray::size(section);
  if (uVar4 < (uint)guid.Data4._0_4_) {
    return 0x14;
  }
  Bstrlib::CBString::CBString((CBString *)((long)&baGuid.d.field_2 + 8));
  UByteArray::UByteArray
            ((UByteArray *)&msgProcessingRequiredAttributeOnUnknownGuidedSection,auStack_a0,0x10);
  msgInvalidCompressedSize = false;
  local_102 = 0;
  local_103 = 0;
  local_104 = 0;
  local_105 = 0;
  local_106 = 0;
  local_107 = 0;
  local_108 = 0;
  crc._3_1_ = 0;
  bVar3 = UByteArray::operator==
                    ((UByteArray *)&msgProcessingRequiredAttributeOnUnknownGuidedSection,
                     &EFI_GUIDED_SECTION_CRC32);
  if (bVar3) {
    if ((sectionHeader._4_2_ & 2) == 0) {
      local_102 = 1;
    }
    uVar4 = UByteArray::size(section);
    if ((ulong)uVar4 < (ulong)(uint)guid.Data4._0_4_ + 4) {
      this_local = (FfsParser *)0x14;
      local_110 = 1;
      goto LAB_001309f4;
    }
    pcVar9 = UByteArray::constData(section);
    local_114 = *(uint *)(pcVar9 + (uint)guid.Data4._0_4_);
    Bstrlib::CBString::CBString((CBString *)local_130,"\nChecksum type: CRC32");
    Bstrlib::CBString::operator+=((CBString *)((long)&baGuid.d.field_2 + 8),(CBString *)local_130);
    Bstrlib::CBString::~CBString((CBString *)local_130);
    pcVar9 = UByteArray::constData(section);
    iVar6 = UByteArray::size(section);
    uVar10 = crc32(0,(uchar *)(pcVar9 + sectionHeader._6_2_),iVar6 - (uint)sectionHeader._6_2_);
    local_134 = (uint)uVar10;
    if (local_114 == local_134) {
      usprintf(&local_150,"\nChecksum: %08Xh, valid",(ulong)local_114);
      Bstrlib::CBString::operator+=((CBString *)((long)&baGuid.d.field_2 + 8),&local_150);
      Bstrlib::CBString::~CBString(&local_150);
    }
    else {
      usprintf((CBString *)&amdZlibSectionHeader,"\nChecksum: %08Xh, invalid, should be %08Xh",
               (ulong)local_114,uVar10 & 0xffffffff);
      Bstrlib::CBString::operator+=
                ((CBString *)((long)&baGuid.d.field_2 + 8),(CBString *)&amdZlibSectionHeader);
      Bstrlib::CBString::~CBString((CBString *)&amdZlibSectionHeader);
      local_105 = 1;
    }
  }
  else {
    bVar3 = UByteArray::operator==
                      ((UByteArray *)&msgProcessingRequiredAttributeOnUnknownGuidedSection,
                       &EFI_GUIDED_SECTION_LZMA);
    if ((((bVar3) ||
         (bVar3 = UByteArray::operator==
                            ((UByteArray *)&msgProcessingRequiredAttributeOnUnknownGuidedSection,
                             &EFI_GUIDED_SECTION_LZMA_HP), bVar3)) ||
        (bVar3 = UByteArray::operator==
                           ((UByteArray *)&msgProcessingRequiredAttributeOnUnknownGuidedSection,
                            &EFI_GUIDED_SECTION_LZMA_MS), bVar3)) ||
       (((bVar3 = UByteArray::operator==
                            ((UByteArray *)&msgProcessingRequiredAttributeOnUnknownGuidedSection,
                             &EFI_GUIDED_SECTION_LZMAF86), bVar3 ||
         (bVar3 = UByteArray::operator==
                            ((UByteArray *)&msgProcessingRequiredAttributeOnUnknownGuidedSection,
                             &EFI_GUIDED_SECTION_TIANO), bVar3)) ||
        (bVar3 = UByteArray::operator==
                           ((UByteArray *)&msgProcessingRequiredAttributeOnUnknownGuidedSection,
                            &EFI_GUIDED_SECTION_GZIP), bVar3)))) {
      if ((sectionHeader._4_2_ & 1) == 0) {
        local_103 = 1;
      }
    }
    else {
      bVar3 = UByteArray::operator==
                        ((UByteArray *)&msgProcessingRequiredAttributeOnUnknownGuidedSection,
                         &EFI_GUIDED_SECTION_ZLIB_AMD);
      if (bVar3) {
        if ((sectionHeader._4_2_ & 1) == 0) {
          local_103 = 1;
        }
        uVar4 = UByteArray::size(section);
        if ((ulong)uVar4 < (ulong)(uint)guid.Data4._0_4_ + 0x100) {
          this_local = (FfsParser *)0x14;
          local_110 = 1;
          goto LAB_001309f4;
        }
        local_170 = UByteArray::constData(section);
        local_170 = local_170 + (uint)guid.Data4._0_4_;
        uVar4 = UByteArray::size(section);
        if ((ulong)uVar4 !=
            (ulong)(uint)guid.Data4._0_4_ + 0x100 + (ulong)*(uint *)(local_170 + 0x14)) {
          crc._3_1_ = 1;
        }
        sectionHeader._6_2_ = sectionHeader._6_2_ + 0x100;
      }
      else {
        bVar3 = UByteArray::operator==
                          ((UByteArray *)&msgProcessingRequiredAttributeOnUnknownGuidedSection,
                           &EFI_CERT_TYPE_RSA2048_SHA256_GUID);
        if (bVar3) {
          if ((sectionHeader._4_2_ & 1) == 0) {
            local_104 = 1;
          }
          uVar4 = UByteArray::size(section);
          if ((ulong)uVar4 < (ulong)(uint)guid.Data4._0_4_ + 0x210) {
            this_local = (FfsParser *)0x14;
            local_110 = 1;
            goto LAB_001309f4;
          }
          sectionHeader._6_2_ = sectionHeader._6_2_ + 0x210;
          Bstrlib::CBString::CBString
                    ((CBString *)&winCertificate,"\nCertificate type: RSA2048/SHA256");
          Bstrlib::CBString::operator+=
                    ((CBString *)((long)&baGuid.d.field_2 + 8),(CBString *)&winCertificate);
          Bstrlib::CBString::~CBString((CBString *)&winCertificate);
          msgInvalidCompressedSize = true;
        }
        else {
          bVar3 = UByteArray::operator==
                            ((UByteArray *)&msgProcessingRequiredAttributeOnUnknownGuidedSection,
                             &EFI_FIRMWARE_CONTENTS_SIGNED_GUID);
          if (bVar3) {
            if ((sectionHeader._4_2_ & 1) == 0) {
              local_104 = 1;
            }
            uVar4 = UByteArray::size(section);
            if ((ulong)uVar4 < (ulong)(uint)guid.Data4._0_4_ + 8) {
              this_local = (FfsParser *)0x14;
              local_110 = 1;
              goto LAB_001309f4;
            }
            pcStack_190 = UByteArray::constData(section);
            pcStack_190 = pcStack_190 + (uint)guid.Data4._0_4_;
            local_194 = *(undefined4 *)pcStack_190;
            local_196 = *(ushort *)(pcStack_190 + 6);
            sectionHeader._6_2_ = sectionHeader._6_2_ + (short)local_194;
            uVar4 = UByteArray::size(section);
            if (uVar4 < sectionHeader._6_2_) {
              this_local = (FfsParser *)0x14;
              local_110 = 1;
              goto LAB_001309f4;
            }
            if (local_196 == 0xef1) {
              Bstrlib::CBString::CBString
                        ((CBString *)&winCertificateUefiGuid,"\nCertificate type: UEFI");
              Bstrlib::CBString::operator+=
                        ((CBString *)((long)&baGuid.d.field_2 + 8),
                         (CBString *)&winCertificateUefiGuid);
              Bstrlib::CBString::~CBString((CBString *)&winCertificateUefiGuid);
              pcVar9 = UByteArray::constData(section);
              certTypeGuid.d.field_2._8_8_ = pcVar9 + (uint)guid.Data4._0_4_;
              UByteArray::UByteArray
                        ((UByteArray *)local_1d8,(char *)(certTypeGuid.d.field_2._8_8_ + 8),0x10);
              bVar3 = UByteArray::operator==
                                ((UByteArray *)local_1d8,&EFI_CERT_TYPE_RSA2048_SHA256_GUID);
              if (bVar3) {
                Bstrlib::CBString::CBString(&local_1f0,"\nCertificate subtype: RSA2048/SHA256");
                Bstrlib::CBString::operator+=((CBString *)((long)&baGuid.d.field_2 + 8),&local_1f0);
                Bstrlib::CBString::~CBString(&local_1f0);
              }
              else {
                Bstrlib::CBString::CBString(&local_220,"\nCertificate subtype: unknown, GUID ");
                guidToUString(&local_238,(EFI_GUID *)(certTypeGuid.d.field_2._8_8_ + 8),true);
                Bstrlib::CBString::operator+(&local_208,&local_220,&local_238);
                Bstrlib::CBString::operator+=((CBString *)((long)&baGuid.d.field_2 + 8),&local_208);
                Bstrlib::CBString::~CBString(&local_208);
                Bstrlib::CBString::~CBString(&local_238);
                Bstrlib::CBString::~CBString(&local_220);
                local_107 = 1;
              }
              UByteArray::~UByteArray((UByteArray *)local_1d8);
            }
            else {
              usprintf((CBString *)((long)&header.d.field_2 + 8),
                       "\nCertificate type: unknown (%04Xh)",(ulong)local_196);
              Bstrlib::CBString::operator+=
                        ((CBString *)((long)&baGuid.d.field_2 + 8),
                         (CBString *)((long)&header.d.field_2 + 8));
              Bstrlib::CBString::~CBString((CBString *)((long)&header.d.field_2 + 8));
              local_106 = 1;
            }
            msgInvalidCompressedSize = true;
          }
          else if ((sectionHeader._4_2_ & 1) == 1) {
            local_108 = 1;
          }
        }
      }
    }
  }
  UByteArray::left((UByteArray *)((long)&body.d.field_2 + 8),section,(uint)sectionHeader._6_2_);
  UByteArray::mid((UByteArray *)&name.super_tagbstring.data,section,(uint)sectionHeader._6_2_,-1);
  guidToUString((CBString *)&info.super_tagbstring.data,(EFI_GUID *)auStack_a0,true);
  Bstrlib::CBString::CBString(&local_2f0,"Section GUID: ");
  guidToUString(&local_308,(EFI_GUID *)auStack_a0,false);
  Bstrlib::CBString::operator+(&local_2d8,&local_2f0,&local_308);
  bVar1 = ffsSize[3];
  uVar4 = UByteArray::size(section);
  uVar7 = UByteArray::size(section);
  uVar8 = UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
  UByteArray::size((UByteArray *)((long)&body.d.field_2 + 8));
  UByteArray::size((UByteArray *)&name.super_tagbstring.data);
  UByteArray::size((UByteArray *)&name.super_tagbstring.data);
  usprintf(&local_320,
           "\nType: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nAttributes: %04Xh"
           ,(ulong)bVar1,(ulong)uVar4,(ulong)uVar7,(ulong)uVar8);
  Bstrlib::CBString::operator+((CBString *)local_2c0,&local_2d8,&local_320);
  Bstrlib::CBString::~CBString(&local_320);
  Bstrlib::CBString::~CBString(&local_2d8);
  Bstrlib::CBString::~CBString(&local_308);
  Bstrlib::CBString::~CBString(&local_2f0);
  Bstrlib::CBString::operator+=((CBString *)local_2c0,(CBString *)((long)&baGuid.d.field_2 + 8));
  if (insertIntoTree) {
    pTVar2 = this->model;
    subtype = ffsSize[3];
    Bstrlib::CBString::CBString(&local_350);
    UByteArray::UByteArray((UByteArray *)&pdata_1.dictionarySize);
    TreeModel::addItem(&local_338,pTVar2,localOffset,'C',subtype,
                       (CBString *)&info.super_tagbstring.data,&local_350,(CBString *)local_2c0,
                       (UByteArray *)((long)&body.d.field_2 + 8),
                       (UByteArray *)&name.super_tagbstring.data,
                       (UByteArray *)&pdata_1.dictionarySize,Movable,parent,'\0');
    index->m = local_338.m;
    index->r = local_338.r;
    index->c = local_338.c;
    index->i = local_338.i;
    UByteArray::~UByteArray((UByteArray *)&pdata_1.dictionarySize);
    Bstrlib::CBString::~CBString(&local_350);
    pdata_1.guid.Data4[0] = '\0';
    pdata_1.guid.Data4[1] = '\0';
    pdata_1.guid.Data4[2] = '\0';
    pdata_1.guid.Data4[3] = '\0';
    auStack_388._0_4_ = auStack_a0;
    auStack_388._4_2_ = attributes;
    auStack_388._6_2_ = dataOffset;
    pdata_1.guid.Data1 = guid.Data1;
    pdata_1.guid.Data2 = guid.Data2;
    pdata_1.guid.Data3 = guid.Data3;
    pTVar2 = this->model;
    UByteArray::UByteArray(&local_3a8,auStack_388,0x14);
    TreeModel::setParsingData(pTVar2,index,&local_3a8);
    UByteArray::~UByteArray(&local_3a8);
    if ((msgInvalidCompressedSize & 1U) != 0) {
      usprintf(&local_3c0,"%s: GUIDed section signature may become invalid after modification",
               "parseGuidedSectionHeader");
      msg(this,&local_3c0,index);
      Bstrlib::CBString::~CBString(&local_3c0);
    }
    if ((local_102 & 1) != 0) {
      usprintf(&local_3d8,"%s: CRC32 GUIDed section without AuthStatusValid attribute",
               "parseGuidedSectionHeader");
      msg(this,&local_3d8,index);
      Bstrlib::CBString::~CBString(&local_3d8);
    }
    if ((local_103 & 1) != 0) {
      usprintf(&local_3f0,"%s: compressed GUIDed section without ProcessingRequired attribute",
               "parseGuidedSectionHeader");
      msg(this,&local_3f0,index);
      Bstrlib::CBString::~CBString(&local_3f0);
    }
    if ((local_104 & 1) != 0) {
      usprintf(&local_408,"%s: signed GUIDed section without ProcessingRequired attribute",
               "parseGuidedSectionHeader");
      msg(this,&local_408,index);
      Bstrlib::CBString::~CBString(&local_408);
    }
    if ((local_105 & 1) != 0) {
      usprintf(&local_420,"%s: CRC32 GUIDed section with invalid checksum",
               "parseGuidedSectionHeader");
      msg(this,&local_420,index);
      Bstrlib::CBString::~CBString(&local_420);
    }
    if ((local_106 & 1) != 0) {
      usprintf(&local_438,"%s: signed GUIDed section with unknown certificate type",
               "parseGuidedSectionHeader");
      msg(this,&local_438,index);
      Bstrlib::CBString::~CBString(&local_438);
    }
    if ((local_107 & 1) != 0) {
      usprintf(&local_450,"%s: signed GUIDed section with unknown certificate subtype",
               "parseGuidedSectionHeader");
      msg(this,&local_450,index);
      Bstrlib::CBString::~CBString(&local_450);
    }
    if ((local_108 & 1) != 0) {
      usprintf(&local_468,"%s: processing required bit set for GUIDed section with unknown GUID",
               "parseGuidedSectionHeader");
      msg(this,&local_468,index);
      Bstrlib::CBString::~CBString(&local_468);
    }
    if ((crc._3_1_ & 1) != 0) {
      usprintf(&local_480,"%s: AMD Zlib-compressed section with invalid compressed size",
               "parseGuidedSectionHeader");
      msg(this,&local_480,index);
      Bstrlib::CBString::~CBString(&local_480);
    }
  }
  this_local = (FfsParser *)0x0;
  local_110 = 1;
  Bstrlib::CBString::~CBString((CBString *)local_2c0);
  Bstrlib::CBString::~CBString((CBString *)&info.super_tagbstring.data);
  UByteArray::~UByteArray((UByteArray *)&name.super_tagbstring.data);
  UByteArray::~UByteArray((UByteArray *)((long)&body.d.field_2 + 8));
LAB_001309f4:
  UByteArray::~UByteArray((UByteArray *)&msgProcessingRequiredAttributeOnUnknownGuidedSection);
  Bstrlib::CBString::~CBString((CBString *)((long)&baGuid.d.field_2 + 8));
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseGuidedSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER))
        return U_INVALID_SECTION;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    UINT32 headerSize;
    EFI_GUID guid;
    UINT16 dataOffset;
    UINT16 attributes;
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    const EFI_COMMON_SECTION_HEADER2* section2Header = (const EFI_COMMON_SECTION_HEADER2*)(section.constData());
    
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED) { // Check for extended header section
        const EFI_GUID_DEFINED_SECTION* guidDefinedSectionHeader = (const EFI_GUID_DEFINED_SECTION*)(section2Header + 1);
        if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_GUID_DEFINED_SECTION))
            return U_INVALID_SECTION;
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_GUID_DEFINED_SECTION);
        guid = guidDefinedSectionHeader->SectionDefinitionGuid;
        dataOffset = guidDefinedSectionHeader->DataOffset;
        attributes = guidDefinedSectionHeader->Attributes;
    }
    else { // Normal section
        const EFI_GUID_DEFINED_SECTION* guidDefinedSectionHeader = (const EFI_GUID_DEFINED_SECTION*)(sectionHeader + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER) + sizeof(EFI_GUID_DEFINED_SECTION);
        guid = guidDefinedSectionHeader->SectionDefinitionGuid;
        dataOffset = guidDefinedSectionHeader->DataOffset;
        attributes = guidDefinedSectionHeader->Attributes;
    }
    // Check sanity again
    if ((UINT32)section.size() < headerSize)
        return U_INVALID_SECTION;
    
    // Check for special GUIDed sections
    UString additionalInfo;
    UByteArray baGuid((const char*)&guid, sizeof(EFI_GUID));
    bool msgSignedSectionFound = false;
    bool msgNoAuthStatusAttribute = false;
    bool msgNoProcessingRequiredAttributeCompressed = false;
    bool msgNoProcessingRequiredAttributeSigned = false;
    bool msgInvalidCrc = false;
    bool msgUnknownCertType = false;
    bool msgUnknownCertSubtype = false;
    bool msgProcessingRequiredAttributeOnUnknownGuidedSection = false;
    bool msgInvalidCompressedSize = false;
    if (baGuid == EFI_GUIDED_SECTION_CRC32) {
        if ((attributes & EFI_GUIDED_SECTION_AUTH_STATUS_VALID) == 0) { // Check that AuthStatusValid attribute is set on compressed GUIDed sections
            msgNoAuthStatusAttribute = true;
        }
        
        if ((UINT32)section.size() < headerSize + sizeof(UINT32))
            return U_INVALID_SECTION;
        
        UINT32 crc = *(UINT32*)(section.constData() + headerSize);
        additionalInfo += UString("\nChecksum type: CRC32");
        // Calculate CRC32 of section data
        UINT32 calculated = (UINT32)crc32(0, (const UINT8*)section.constData() + dataOffset, (uInt)(section.size() - dataOffset));
        if (crc == calculated) {
            additionalInfo += usprintf("\nChecksum: %08Xh, valid", crc);
        }
        else {
            additionalInfo += usprintf("\nChecksum: %08Xh, invalid, should be %08Xh", crc, calculated);
            msgInvalidCrc = true;
        }
        // No need to change dataOffset here
    }
    else if (baGuid == EFI_GUIDED_SECTION_LZMA
        || baGuid == EFI_GUIDED_SECTION_LZMA_HP
        || baGuid == EFI_GUIDED_SECTION_LZMA_MS
        || baGuid == EFI_GUIDED_SECTION_LZMAF86
        || baGuid == EFI_GUIDED_SECTION_TIANO
        || baGuid == EFI_GUIDED_SECTION_GZIP) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on compressed GUIDed sections
            msgNoProcessingRequiredAttributeCompressed = true;
        }
        // No need to change dataOffset here
    }
    else if (baGuid == EFI_GUIDED_SECTION_ZLIB_AMD) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on compressed GUIDed sections
            msgNoProcessingRequiredAttributeCompressed = true;
        }

        if ((UINT32)section.size() < headerSize + sizeof(EFI_AMD_ZLIB_SECTION_HEADER))
            return U_INVALID_SECTION;

        const EFI_AMD_ZLIB_SECTION_HEADER* amdZlibSectionHeader = (const EFI_AMD_ZLIB_SECTION_HEADER*)(section.constData() + headerSize);

        // Check the compressed size to be sane
        if ((UINT32)section.size() != headerSize + sizeof(EFI_AMD_ZLIB_SECTION_HEADER) + amdZlibSectionHeader->CompressedSize) {
            msgInvalidCompressedSize = true;
        }

        // Adjust dataOffset
        dataOffset += sizeof(EFI_AMD_ZLIB_SECTION_HEADER);
    }
    else if (baGuid == EFI_CERT_TYPE_RSA2048_SHA256_GUID) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on signed GUIDed sections
            msgNoProcessingRequiredAttributeSigned = true;
        }
        
        // Get certificate type and length
        if ((UINT32)section.size() < headerSize + sizeof(EFI_CERT_BLOCK_RSA2048_SHA256))
            return U_INVALID_SECTION;
        
        // Adjust dataOffset
        dataOffset += sizeof(EFI_CERT_BLOCK_RSA2048_SHA256);
        additionalInfo += UString("\nCertificate type: RSA2048/SHA256");
        msgSignedSectionFound = true;
    }
    else if (baGuid == EFI_FIRMWARE_CONTENTS_SIGNED_GUID) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on signed GUIDed sections
            msgNoProcessingRequiredAttributeSigned = true;
        }
        
        // Get certificate type and length
        if ((UINT32)section.size() < headerSize + sizeof(WIN_CERTIFICATE))
            return U_INVALID_SECTION;
        
        const WIN_CERTIFICATE* winCertificate = (const WIN_CERTIFICATE*)(section.constData() + headerSize);
        UINT32 certLength = winCertificate->Length;
        UINT16 certType = winCertificate->CertificateType;
        
        // Adjust dataOffset
        dataOffset += certLength;
        
        // Check section size once again
        if ((UINT32)section.size() < dataOffset)
            return U_INVALID_SECTION;
        
        // Check certificate type
        if (certType == WIN_CERT_TYPE_EFI_GUID) {
            additionalInfo += UString("\nCertificate type: UEFI");
            
            // Get certificate GUID
            const WIN_CERTIFICATE_UEFI_GUID* winCertificateUefiGuid = (const WIN_CERTIFICATE_UEFI_GUID*)(section.constData() + headerSize);
            UByteArray certTypeGuid((const char*)&winCertificateUefiGuid->CertType, sizeof(EFI_GUID));
            
            if (certTypeGuid == EFI_CERT_TYPE_RSA2048_SHA256_GUID) {
                additionalInfo += UString("\nCertificate subtype: RSA2048/SHA256");
            }
            else {
                additionalInfo += UString("\nCertificate subtype: unknown, GUID ") + guidToUString(winCertificateUefiGuid->CertType);
                msgUnknownCertSubtype = true;
            }
        }
        else {
            additionalInfo += usprintf("\nCertificate type: unknown (%04Xh)", certType);
            msgUnknownCertType = true;
        }
        msgSignedSectionFound = true;
    }
    // Check that ProcessingRequired attribute is not set on GUIDed sections with unknown GUID
    else if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == EFI_GUIDED_SECTION_PROCESSING_REQUIRED) {
        msgProcessingRequiredAttributeOnUnknownGuidedSection = true;
    }
    
    UByteArray header = section.left(dataOffset);
    UByteArray body = section.mid(dataOffset);
    
    // Get info
    UString name = guidToUString(guid);
    UString info = UString("Section GUID: ") + guidToUString(guid, false) +
    usprintf("\nType: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nAttributes: %04Xh",
             sectionHeader->Type,
             (UINT32)section.size(), (UINT32)section.size(),
             (UINT32)header.size(), (UINT32)header.size(),
             (UINT32)body.size(), (UINT32)body.size(),
             attributes);
    
    // Append additional info
    info += additionalInfo;
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, sectionHeader->Type, name, UString(), info, header, body, UByteArray(), Movable, parent);
        
        // Set parsing data
        GUIDED_SECTION_PARSING_DATA pdata = {};
        pdata.guid = guid;
        model->setParsingData(index, UByteArray((const char*)&pdata, sizeof(pdata)));
        
        // Show messages
        if (msgSignedSectionFound)
            msg(usprintf("%s: GUIDed section signature may become invalid after modification", __FUNCTION__), index);
        if (msgNoAuthStatusAttribute)
            msg(usprintf("%s: CRC32 GUIDed section without AuthStatusValid attribute", __FUNCTION__), index);
        if (msgNoProcessingRequiredAttributeCompressed)
            msg(usprintf("%s: compressed GUIDed section without ProcessingRequired attribute", __FUNCTION__), index);
        if (msgNoProcessingRequiredAttributeSigned)
            msg(usprintf("%s: signed GUIDed section without ProcessingRequired attribute", __FUNCTION__), index);
        if (msgInvalidCrc)
            msg(usprintf("%s: CRC32 GUIDed section with invalid checksum", __FUNCTION__), index);
        if (msgUnknownCertType)
            msg(usprintf("%s: signed GUIDed section with unknown certificate type", __FUNCTION__), index);
        if (msgUnknownCertSubtype)
            msg(usprintf("%s: signed GUIDed section with unknown certificate subtype", __FUNCTION__), index);
        if (msgProcessingRequiredAttributeOnUnknownGuidedSection)
            msg(usprintf("%s: processing required bit set for GUIDed section with unknown GUID", __FUNCTION__), index);
        if (msgInvalidCompressedSize)
            msg(usprintf("%s: AMD Zlib-compressed section with invalid compressed size", __FUNCTION__), index);
    }
    
    return U_SUCCESS;
}